

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vttdemux.cc
# Opt level: O0

void __thiscall
libwebm::vttdemux::FrameParser::FrameParser(FrameParser *this,BlockGroup *block_group)

{
  int iVar1;
  undefined4 extraout_var;
  Frame *pFVar2;
  Frame *f;
  Block *block;
  BlockGroup *block_group_local;
  FrameParser *this_local;
  
  libwebvtt::LineReader::LineReader(&this->super_LineReader);
  (this->super_LineReader).super_Reader._vptr_Reader = (_func_int **)&PTR_GetChar_00148ad0;
  this->block_group_ = block_group;
  iVar1 = (*(block_group->super_BlockEntry)._vptr_BlockEntry[2])();
  pFVar2 = mkvparser::Block::GetFrame((Block *)CONCAT44(extraout_var,iVar1),0);
  this->pos_ = pFVar2->pos;
  this->pos_end_ = pFVar2->pos + pFVar2->len;
  return;
}

Assistant:

FrameParser::FrameParser(const mkvparser::BlockGroup* block_group)
    : block_group_(block_group) {
  const mkvparser::Block* const block = block_group->GetBlock();
  const mkvparser::Block::Frame& f = block->GetFrame(0);

  // The beginning and end of the character stream corresponds to the
  // position of this block's frame within the WebM input file.

  pos_ = f.pos;
  pos_end_ = f.pos + f.len;
}